

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::flushRefAsResult
          (EarlyCastFinder *this,size_t index,Module *module)

{
  RefAs *pRVar1;
  reference __k;
  reference pvVar2;
  RefAs **ppRVar3;
  LocalGet *pLVar4;
  mapped_type *ppRVar5;
  Expression *fallthrough;
  RefAs **bestCast;
  LocalGet **target;
  Module *module_local;
  size_t index_local;
  EarlyCastFinder *this_local;
  
  __k = std::
        vector<wasm::(anonymous_namespace)::RefAsInfo,_std::allocator<wasm::(anonymous_namespace)::RefAsInfo>_>
        ::operator[](&this->currRefAsMove,index);
  if (__k->target != (LocalGet *)0x0) {
    pvVar2 = std::
             vector<wasm::(anonymous_namespace)::RefAsInfo,_std::allocator<wasm::(anonymous_namespace)::RefAsInfo>_>
             ::operator[](&this->currRefAsMove,index);
    ppRVar3 = &pvVar2->bestCast;
    if (*ppRVar3 != (RefAs *)0x0) {
      pLVar4 = (LocalGet *)
               Properties::getFallthrough((Expression *)*ppRVar3,&this->options,module,AllowTeeBrIf)
      ;
      if (pLVar4 != __k->target) {
        pRVar1 = *ppRVar3;
        ppRVar5 = std::
                  unordered_map<wasm::LocalGet_*,_wasm::RefAs_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>_>
                  ::operator[](&this->refAsToApply,&__k->target);
        *ppRVar5 = pRVar1;
      }
      *ppRVar3 = (RefAs *)0x0;
    }
    __k->target = (LocalGet *)0x0;
  }
  return;
}

Assistant:

void flushRefAsResult(size_t index, Module& module) {
    auto& target = currRefAsMove[index].target;
    if (target) {
      auto& bestCast = currRefAsMove[index].bestCast;
      if (bestCast) {
        // As in flushRefCastResult, we need to check if the cast is already at
        // the target and thus does not need to be moved.
        auto* fallthrough =
          Properties::getFallthrough(bestCast, options, module);
        if (fallthrough != target) {
          refAsToApply[target] = bestCast;
        }
        bestCast = nullptr;
      }
      target = nullptr;
    }
  }